

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
BerlekampMassey<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *syndromes,size_t max_degree,
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          *field)

{
  long lVar1;
  int iVar2;
  Elem EVar3;
  uint uVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  const_reference pvVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  Multiplier *pMVar11;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_RCX;
  ulong in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  size_t i_1;
  bool swap;
  int x;
  size_t i;
  value_type discrepancy;
  size_t n;
  bool b_have_inv;
  Elem b_inv;
  Elem b;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  vector<unsigned_int,_std::allocator<unsigned_int>_> current;
  vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
  table;
  Multiplier mul;
  undefined4 in_stack_fffffffffffffcb8;
  Elem in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc0;
  Elem in_stack_fffffffffffffcc4;
  Multiplier *in_stack_fffffffffffffcc8;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_fffffffffffffcd0;
  Elem in_stack_fffffffffffffcd8;
  Elem in_stack_fffffffffffffcdc;
  size_type in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  Multiplier *local_2d0;
  ulong local_2b8;
  undefined4 in_stack_fffffffffffffd50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
  ::vector((vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
            *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),in_stack_fffffffffffffcf0
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),in_stack_fffffffffffffcf0
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),in_stack_fffffffffffffcf0
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (size_type)in_stack_fffffffffffffcd0);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffcc8,
                      CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  *pvVar5 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (size_type)in_stack_fffffffffffffcd0);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffcc8,
                      CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  *pvVar5 = 1;
  bVar14 = true;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  std::
  vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
  ::reserve((vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
             *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
            in_stack_fffffffffffffcf0);
  pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  do {
    this = pvVar15;
    pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    if (pvVar15 == pvVar6) {
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      bVar14 = false;
      if (sVar8 != 0) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        bVar14 = *pvVar5 != 0;
      }
      if (bVar14) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x151fff6);
      }
      else {
        memset(in_RDI,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      }
LAB_01520001:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcc8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcc8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcc8);
      std::
      vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
      ::~vector((vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                 *)in_stack_fffffffffffffcc8);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcc8,
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    std::
    vector<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,std::allocator<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>>
    ::
    emplace_back<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>const&,unsigned_int_const&>
              ((vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               in_stack_fffffffffffffcd0,(uint *)in_stack_fffffffffffffcc8);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffcc8,
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    uVar4 = *pvVar7;
    for (local_2b8 = 1;
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)),
        local_2b8 < sVar8; local_2b8 = local_2b8 + 1) {
      std::
      vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
      ::operator[]((vector<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                    *)in_stack_fffffffffffffcc8,
                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcc8,
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      EVar3 = anon_unknown.dwarf_250df77::
              Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              ::Multiplier::operator()
                        ((Multiplier *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                         ,0);
      uVar4 = EVar3 ^ uVar4;
    }
    if (uVar4 != 0) {
      iVar2 = (int)this;
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      if (!bVar14) {
        in_stack_fffffffffffffcdc =
             anon_unknown.dwarf_250df77::
             Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
             ::Inv((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),0);
        bVar14 = true;
      }
      sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((sVar10 - 1) * 2);
      bVar12 = pvVar15 < this;
      bVar13 = (long)pvVar15 - (long)this == 0;
      if (bVar12 || bVar13) {
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        if (in_RDX < (sVar10 + (long)(((iVar2 + 1) - ((int)sVar8 + -1)) - ((int)sVar9 + -1))) - 1) {
          memset(in_RDI,0,0x18);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          goto LAB_01520001;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(uVar4,in_stack_fffffffffffffd50));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   (size_type)in_stack_fffffffffffffcd0);
      }
      in_stack_fffffffffffffcd0 = in_RCX;
      in_stack_fffffffffffffcd8 =
           anon_unknown.dwarf_250df77::
           Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
           ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (Elem)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(Elem)in_stack_fffffffffffffcc8);
      anon_unknown.dwarf_250df77::
      Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
      ::Multiplier::Multiplier
                (in_stack_fffffffffffffcc8,
                 (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcbc);
      local_2d0 = (Multiplier *)0x0;
      while (in_stack_fffffffffffffcc8 = local_2d0,
            pMVar11 = (Multiplier *)
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)),
            in_stack_fffffffffffffcc8 < pMVar11) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcc8,
                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        in_stack_fffffffffffffcc4 =
             anon_unknown.dwarf_250df77::
             Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
             ::Multiplier::operator()
                       ((Multiplier *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                        0);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffcc8,
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        *pvVar5 = in_stack_fffffffffffffcc4 ^ *pvVar5;
        local_2d0 = (Multiplier *)
                    ((long)&((_Vector_impl_data *)(local_2d0->table).trans.table)->_M_start + 1);
      }
      if (bVar12 || bVar13) {
        std::swap<unsigned_int,std::allocator<unsigned_int>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x151ff44);
        bVar14 = false;
      }
    }
    pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              ((long)&(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

std::vector<typename F::Elem> BerlekampMassey(const std::vector<typename F::Elem>& syndromes, size_t max_degree, const F& field) {
    std::vector<typename F::Multiplier> table;
    std::vector<typename F::Elem> current, prev, tmp;
    current.reserve(syndromes.size() / 2 + 1);
    prev.reserve(syndromes.size() / 2 + 1);
    tmp.reserve(syndromes.size() / 2 + 1);
    current.resize(1);
    current[0] = 1;
    prev.resize(1);
    prev[0] = 1;
    typename F::Elem b = 1, b_inv = 1;
    bool b_have_inv = true;
    table.reserve(syndromes.size());

    for (size_t n = 0; n != syndromes.size(); ++n) {
        table.emplace_back(field, syndromes[n]);
        auto discrepancy = syndromes[n];
        for (size_t i = 1; i < current.size(); ++i) discrepancy ^= table[n - i](current[i]);
        if (discrepancy != 0) {
            int x = static_cast<int>(n + 1 - (current.size() - 1) - (prev.size() - 1));
            if (!b_have_inv) {
                b_inv = field.Inv(b);
                b_have_inv = true;
            }
            bool swap = 2 * (current.size() - 1) <= n;
            if (swap) {
                if (prev.size() + x - 1 > max_degree) return {}; // We'd exceed maximum degree
                tmp = current;
                current.resize(prev.size() + x);
            }
            typename F::Multiplier mul(field, field.Mul(discrepancy, b_inv));
            for (size_t i = 0; i < prev.size(); ++i) current[i + x] ^= mul(prev[i]);
            if (swap) {
                std::swap(prev, tmp);
                b = discrepancy;
                b_have_inv = false;
            }
        }
    }
    CHECK_RETURN(current.size() && current.back() != 0, {});
    return current;
}